

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_keyexpimp.c
# Opt level: O0

int gost_kdftree2012_256
              (uchar *keyout,size_t keyout_len,uchar *key,size_t keylen,uchar *label,
              size_t label_len,uchar *seed,size_t seed_len,size_t representation)

{
  int iVar1;
  char *name;
  EVP_MD *md;
  undefined8 in_RCX;
  void *in_RDX;
  ulong in_RSI;
  uchar *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  uchar *in_stack_00000008;
  size_t in_stack_00000010;
  uchar *rep_ptr;
  uint32_t iter_net;
  size_t len_repr_len;
  uint32_t len_repr;
  uchar *len_ptr;
  HMAC_CTX *ctx;
  uchar *ptr;
  uchar zero;
  int i;
  int iters;
  char *in_stack_ffffffffffffff68;
  HMAC_CTX *ctx_00;
  undefined8 in_stack_ffffffffffffff70;
  void *key_00;
  size_t local_70;
  uint32_t local_64;
  uint32_t *local_60;
  HMAC_CTX *local_58;
  uchar *local_50;
  uchar local_41;
  uint32_t local_40;
  int local_3c;
  size_t local_38;
  uchar *local_30;
  undefined8 local_28;
  void *local_20;
  ulong local_18;
  int local_4;
  
  local_40 = 0;
  local_41 = '\0';
  local_60 = (uint32_t *)0x0;
  local_50 = in_RDI;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_64 = be32((uint32_t)(in_RSI << 3));
  local_70 = 4;
  local_58 = (HMAC_CTX *)HMAC_CTX_new();
  iVar1 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  if (local_58 == (HMAC_CTX *)0x0) {
    ERR_GOST_error(iVar1,(int)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
    local_4 = 0;
  }
  else if ((local_18 == 0) || ((local_18 & 0x1f) != 0)) {
    ERR_GOST_error(iVar1,(int)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
    local_4 = 0;
  }
  else {
    local_3c = (int)(local_18 >> 5);
    for (local_60 = &local_64; (char)*local_60 == '\0'; local_60 = (uint32_t *)((long)local_60 + 1))
    {
      local_70 = local_70 - 1;
    }
    for (local_40 = 1; (int)local_40 <= local_3c; local_40 = local_40 + 1) {
      be32(local_40);
      iVar1 = (int)local_28;
      ctx_00 = local_58;
      key_00 = local_20;
      name = OBJ_nid2sn(0x3d6);
      md = EVP_get_digestbyname(name);
      iVar1 = HMAC_Init_ex(ctx_00,key_00,iVar1,md,(ENGINE *)0x0);
      if ((((iVar1 < 1) ||
           (iVar1 = HMAC_Update(local_58,(uchar *)((long)&local_70 - (long)rep_ptr),(size_t)rep_ptr)
           , iVar1 < 1)) || (iVar1 = HMAC_Update(local_58,local_30,local_38), iVar1 < 1)) ||
         (((iVar1 = HMAC_Update(local_58,&local_41,1), iVar1 < 1 ||
           (iVar1 = HMAC_Update(local_58,in_stack_00000008,in_stack_00000010), iVar1 < 1)) ||
          ((iVar1 = HMAC_Update(local_58,(uchar *)local_60,local_70), iVar1 < 1 ||
           (iVar1 = HMAC_Final(local_58,local_50,(uint *)0x0), iVar1 < 1)))))) {
        ERR_GOST_error((int)((ulong)key_00 >> 0x20),(int)key_00,(char *)ctx_00,0);
        HMAC_CTX_free(local_58);
        return 0;
      }
      HMAC_CTX_reset(local_58);
      local_50 = local_50 + 0x20;
    }
    HMAC_CTX_free(local_58);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int gost_kdftree2012_256(unsigned char *keyout, size_t keyout_len,
                         const unsigned char *key, size_t keylen,
                         const unsigned char *label, size_t label_len,
                         const unsigned char *seed, size_t seed_len,
                         const size_t representation)
{
    int iters, i = 0;
    unsigned char zero = 0;
    unsigned char *ptr = keyout;
    HMAC_CTX *ctx;
    unsigned char *len_ptr = NULL;
    uint32_t len_repr = be32(keyout_len * 8);
    size_t len_repr_len = 4;

    ctx = HMAC_CTX_new();
    if (ctx == NULL) {
        GOSTerr(GOST_F_GOST_KDFTREE2012_256, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    if ((keyout_len == 0) || (keyout_len % 32 != 0)) {
        GOSTerr(GOST_F_GOST_KDFTREE2012_256, ERR_R_INTERNAL_ERROR);
        return 0;
    }
    iters = keyout_len / 32;

    len_ptr = (unsigned char *)&len_repr;
    while (*len_ptr == 0) {
        len_ptr++;
        len_repr_len--;
    }

    for (i = 1; i <= iters; i++) {
        uint32_t iter_net = be32(i);
        unsigned char *rep_ptr =
            ((unsigned char *)&iter_net) + (4 - representation);

        if (HMAC_Init_ex(ctx, key, keylen,
                         EVP_get_digestbynid(NID_id_GostR3411_2012_256),
                         NULL) <= 0
            || HMAC_Update(ctx, rep_ptr, representation) <= 0
            || HMAC_Update(ctx, label, label_len) <= 0
            || HMAC_Update(ctx, &zero, 1) <= 0
            || HMAC_Update(ctx, seed, seed_len) <= 0
            || HMAC_Update(ctx, len_ptr, len_repr_len) <= 0
            || HMAC_Final(ctx, ptr, NULL) <= 0) {
            GOSTerr(GOST_F_GOST_KDFTREE2012_256, ERR_R_INTERNAL_ERROR);
            HMAC_CTX_free(ctx);
            return 0;
        }

        HMAC_CTX_reset(ctx);
        ptr += 32;
    }

    HMAC_CTX_free(ctx);

    return 1;
}